

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

void getProjectGroupFilesRec
               (Output *output,ProjectGroup *group,
               vector<FileInfo,_std::allocator<FileInfo>_> *files)

{
  bool bVar1;
  undefined8 uVar2;
  ProjectGroup *in_RDX;
  Output *in_RSI;
  anon_class_32_4_5af47e4e *in_RDI;
  unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> *child;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
  *__range1_2;
  bool result;
  string buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *folder;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  uint64_t size;
  uint64_t mtime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  value_type *in_stack_fffffffffffffe58;
  anon_class_32_4_5af47e4e *in_stack_fffffffffffffe60;
  anon_class_32_4_5af47e4e *in_stack_fffffffffffffe68;
  function<void_(const_char_*,_unsigned_long,_unsigned_long)> *in_stack_fffffffffffffe70;
  __normal_iterator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_*,_std::vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>_>
  local_148;
  Output *local_140;
  undefined1 *local_138;
  _Invoker_type in_stack_fffffffffffffee8;
  uint64_t *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  string local_c8 [32];
  reference local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  Output *local_90;
  string local_78 [32];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  vector<FileInfo,_std::allocator<FileInfo>_> *files_00;
  
  files_00 = (vector<FileInfo,_std::allocator<FileInfo>_> *)(in_RSI + 4);
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe58);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
    std::__cxx11::string::c_str();
    bVar1 = getFileAttributes(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              (uint64_t *)in_stack_fffffffffffffee8);
    if (bVar1) {
      std::__cxx11::string::string(local_78,(string *)local_38);
      local_58 = local_40;
      local_50 = local_48;
      std::vector<FileInfo,_std::allocator<FileInfo>_>::push_back
                ((vector<FileInfo,_std::allocator<FileInfo>_> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      FileInfo::~FileInfo((FileInfo *)0x146c33);
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      (**(code **)&(((((_Tuple_impl<0UL,_ProjectGroup_*,_std::default_delete<ProjectGroup>_> *)
                      &(((_Vector_base<FileInfo,_std::allocator<FileInfo>_> *)&in_RDI->group)->
                       _M_impl).super__Vector_impl_data._M_start)->
                     super__Head_base<0UL,_ProjectGroup_*,_false>)._M_head_impl)->files).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl)(in_RDI,"Error reading metadata for file %s\n",uVar2);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  local_90 = in_RSI + 1;
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe58);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
    std::__cxx11::string::string(local_c8);
    std::__cxx11::string::c_str();
    std::function<void(char_const*,unsigned_long,unsigned_long)>::
    function<getProjectGroupFilesRec(Output*,ProjectGroup*,std::vector<FileInfo,std::allocator<FileInfo>>&)::__0,void>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_138 = &stack0xfffffffffffffff0;
    in_stack_fffffffffffffe70 =
         (function<void_(const_char_*,_unsigned_long,_unsigned_long)> *)&stack0xfffffffffffffed0;
    std::function<bool(char_const*)>::
    function<getProjectGroupFilesRec(Output*,ProjectGroup*,std::vector<FileInfo,std::allocator<FileInfo>>&)::__1,void>
              ((function<bool_(const_char_*)> *)in_stack_fffffffffffffe70,
               (anon_class_8_1_a7fae59f *)in_stack_fffffffffffffe68);
    bVar1 = traverseDirectory((char *)in_stack_fffffffffffffe60,
                              (function<void_(const_char_*,_unsigned_long,_unsigned_long)> *)
                              in_stack_fffffffffffffe58,(function<bool_(const_char_*)> *)0x146dc4);
    std::function<bool_(const_char_*)>::~function((function<bool_(const_char_*)> *)0x146dd4);
    std::function<void_(const_char_*,_unsigned_long,_unsigned_long)>::~function
              ((function<void_(const_char_*,_unsigned_long,_unsigned_long)> *)0x146de1);
    if (!bVar1) {
      in_stack_fffffffffffffe68 = in_RDI;
      uVar2 = std::__cxx11::string::c_str();
      (**(code **)&(((((_Tuple_impl<0UL,_ProjectGroup_*,_std::default_delete<ProjectGroup>_> *)
                      &(((_Vector_base<FileInfo,_std::allocator<FileInfo>_> *)
                        &in_stack_fffffffffffffe68->group)->_M_impl).super__Vector_impl_data.
                       _M_start)->super__Head_base<0UL,_ProjectGroup_*,_false>)._M_head_impl)->files
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl)(in_stack_fffffffffffffe68,"Error reading folder %s\n",uVar2);
    }
    std::__cxx11::string::~string(local_c8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_98);
  }
  local_140 = in_RSI + 0xb;
  local_148._M_current =
       (unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> *)
       std::
       vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
       ::begin((vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
                *)in_stack_fffffffffffffe58);
  std::
  vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
  ::end((vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
         *)in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_*,_std::vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_*,_std::vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_*,_std::vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>_>
    ::operator*(&local_148);
    in_stack_fffffffffffffe60 = in_RDI;
    std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>::get
              ((unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> *)in_RDI);
    getProjectGroupFilesRec(in_RSI,in_RDX,files_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_*,_std::vector<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>_>
    ::operator++(&local_148);
  }
  return;
}

Assistant:

static void getProjectGroupFilesRec(Output* output, ProjectGroup* group, std::vector<FileInfo>& files)
{
	for (auto& path: group->files)
	{
		uint64_t mtime, size;

		if (getFileAttributes(path.c_str(), &mtime, &size))
			files.push_back({ path, mtime, size });
		else
			output->error("Error reading metadata for file %s\n", path.c_str());
	}

	for (auto& folder: group->paths)
	{
		std::string buf;

		bool result = traverseDirectory(folder.c_str(), [&](const char* path, uint64_t mtime, uint64_t size) {
			if (isFileAcceptable(group, path))
			{
				joinPaths(buf, folder.c_str(), path);
				files.push_back({ buf, mtime, size });
			}
			}, [&](const char* path) {
				return isDirectoryAcceptable(group, path);
			});

		if (!result) output->error("Error reading folder %s\n", folder.c_str());
	}

	for (auto& child: group->groups)
		getProjectGroupFilesRec(output, child.get(), files);
}